

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O0

BuildResult __thiscall
anon_unknown.dwarf_5ec65::ParseCommandActions::actOnBeginBuildDecl
          (ParseCommandActions *this,Token *name,ArrayRef<llbuild::ninja::Token> outputs,
          ArrayRef<llbuild::ninja::Token> inputs,uint numExplicitInputs,uint numImplicitInputs)

{
  ostream *poVar1;
  string local_e0;
  Token *local_c0;
  Token *name_2;
  iterator __end2_1;
  iterator __begin2_1;
  ArrayRef<llbuild::ninja::Token> *__range2_1;
  Token *local_80;
  Token *name_1;
  iterator __end2;
  iterator __begin2;
  ArrayRef<llbuild::ninja::Token> *__range2;
  undefined1 local_58 [7];
  bool first;
  Token *local_38;
  Token *name_local;
  ParseCommandActions *this_local;
  ArrayRef<llbuild::ninja::Token> inputs_local;
  ArrayRef<llbuild::ninja::Token> outputs_local;
  
  inputs_local.Data = (Token *)inputs.Length;
  this_local = (ParseCommandActions *)inputs.Data;
  inputs_local.Length = (size_type)outputs.Data;
  local_38 = name;
  name_local = (Token *)this;
  poVar1 = std::operator<<((ostream *)&std::cerr,"actOnBeginBuildDecl");
  poVar1 = std::operator<<(poVar1,"(/*Name=*/");
  poVar1 = std::operator<<(poVar1,"\"");
  escapedString_abi_cxx11_((string *)local_58,local_38);
  poVar1 = std::operator<<(poVar1,(string *)local_58);
  poVar1 = std::operator<<(poVar1,"\"");
  std::operator<<(poVar1,", /*Outputs=*/[");
  std::__cxx11::string::~string((string *)local_58);
  __range2._7_1_ = 1;
  __begin2 = (iterator)&inputs_local.Length;
  __end2 = llvm::ArrayRef<llbuild::ninja::Token>::begin((ArrayRef<llbuild::ninja::Token> *)__begin2)
  ;
  name_1 = llvm::ArrayRef<llbuild::ninja::Token>::end((ArrayRef<llbuild::ninja::Token> *)__begin2);
  for (; __end2 != name_1; __end2 = __end2 + 1) {
    local_80 = __end2;
    if ((__range2._7_1_ & 1) == 0) {
      std::operator<<((ostream *)&std::cerr,", ");
    }
    poVar1 = std::operator<<((ostream *)&std::cerr,"\"");
    escapedString_abi_cxx11_((string *)&__range2_1,local_80);
    poVar1 = std::operator<<(poVar1,(string *)&__range2_1);
    std::operator<<(poVar1,"\"");
    std::__cxx11::string::~string((string *)&__range2_1);
    __range2._7_1_ = 0;
  }
  std::operator<<((ostream *)&std::cerr,"], /*Inputs=*/[");
  __range2._7_1_ = 1;
  __begin2_1 = (iterator)&this_local;
  __end2_1 = llvm::ArrayRef<llbuild::ninja::Token>::begin
                       ((ArrayRef<llbuild::ninja::Token> *)__begin2_1);
  name_2 = llvm::ArrayRef<llbuild::ninja::Token>::end((ArrayRef<llbuild::ninja::Token> *)__begin2_1)
  ;
  for (; __end2_1 != name_2; __end2_1 = __end2_1 + 1) {
    local_c0 = __end2_1;
    if ((__range2._7_1_ & 1) == 0) {
      std::operator<<((ostream *)&std::cerr,", ");
    }
    poVar1 = std::operator<<((ostream *)&std::cerr,"\"");
    escapedString_abi_cxx11_(&local_e0,local_c0);
    poVar1 = std::operator<<(poVar1,(string *)&local_e0);
    std::operator<<(poVar1,"\"");
    std::__cxx11::string::~string((string *)&local_e0);
    __range2._7_1_ = 0;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"], /*NumExplicitInputs=*/");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,numExplicitInputs);
  poVar1 = std::operator<<(poVar1,", /*NumImplicitInputs=*/");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,numImplicitInputs);
  std::operator<<(poVar1,")\n");
  return (BuildResult)0x0;
}

Assistant:

virtual BuildResult
  actOnBeginBuildDecl(const ninja::Token& name,
                      ArrayRef<ninja::Token> outputs,
                      ArrayRef<ninja::Token> inputs,
                      unsigned numExplicitInputs,
                      unsigned numImplicitInputs) override {
    std::cerr << __FUNCTION__ << "(/*Name=*/"
              << "\"" << escapedString(name) << "\""
              << ", /*Outputs=*/[";
    bool first = true;
    for (auto& name: outputs) {
      if (!first)
        std::cerr << ", ";
      std::cerr << "\"" << escapedString(name) << "\"";
      first = false;
    }
    std::cerr << "], /*Inputs=*/[";
    first = true;
    for (auto& name: inputs) {
      if (!first)
        std::cerr << ", ";
      std::cerr << "\"" << escapedString(name) << "\"";
      first = false;
    }
    std::cerr << "], /*NumExplicitInputs=*/" << numExplicitInputs
              << ", /*NumImplicitInputs=*/"  << numImplicitInputs << ")\n";
    return 0;
  }